

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::LogicalAndExp(SQParser *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  Expr *pEVar6;
  Expr *pEVar7;
  Chunk *pCVar8;
  Expr *pEVar9;
  
  uVar4 = this->_depth;
  if (500 < uVar4) {
    reportDiagnostic(this,0x1d);
    uVar4 = this->_depth;
  }
  this->_depth = uVar4 + 1;
  pEVar6 = BitwiseOrExp(this);
  uVar4 = this->_depth;
  if (500 < uVar4) {
    reportDiagnostic(this,0x1d);
    uVar4 = this->_depth;
  }
  uVar5 = uVar4 + 1;
  this->_depth = uVar5;
  pEVar9 = pEVar6;
  if (this->_token == 0x10e) {
    Lex(this);
    pEVar7 = LogicalAndExp(this);
    pCVar8 = Arena::findChunk(this->_astArena,0x30);
    pEVar9 = (Expr *)pCVar8->_ptr;
    pCVar8->_ptr = (uint8_t *)&pEVar9[1].super_Node._coordinates.lineEnd;
    (pEVar9->super_Node)._op = TO_ANDAND;
    (pEVar9->super_Node)._coordinates.lineStart = -1;
    (pEVar9->super_Node)._coordinates.columnStart = -1;
    (pEVar9->super_Node)._coordinates.lineEnd = -1;
    (pEVar9->super_Node)._coordinates.columnEnd = -1;
    (pEVar9->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2c10;
    pEVar9[1].super_Node.super_ArenaObj._vptr_ArenaObj = (_func_int **)pEVar6;
    *(Expr **)&pEVar9[1].super_Node._coordinates = pEVar7;
    iVar2 = (pEVar7->super_Node)._coordinates.lineEnd;
    iVar3 = (pEVar7->super_Node)._coordinates.columnEnd;
    iVar1 = (pEVar6->super_Node)._coordinates.columnStart;
    (pEVar9->super_Node)._coordinates.lineStart = (pEVar6->super_Node)._coordinates.lineStart;
    (pEVar9->super_Node)._coordinates.columnStart = iVar1;
    (pEVar9->super_Node)._coordinates.lineEnd = iVar2;
    (pEVar9->super_Node)._coordinates.columnEnd = iVar3;
    uVar5 = this->_depth;
  }
  this->_depth = uVar5 - 2;
  return pEVar9;
}

Assistant:

Expr* SQParser::LogicalAndExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseOrExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_AND: {
            Lex();

            Expr *rhs = LogicalAndExp();
            lhs = newNode<BinExpr>(TO_ANDAND, lhs, rhs);
        }
        default:
            return lhs;
        }
    }
}